

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

NewOpRequirements __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GetNewOp
          (MessageGenerator *this,Printer *arena_emitter)

{
  Options *options;
  int iVar1;
  bool bVar2;
  bool bVar3;
  ArenaDtorNeeds AVar4;
  CType CVar5;
  OneofDescriptor *pOVar6;
  FieldGenerator *pFVar7;
  byte bVar8;
  uint3 uVar9;
  string_view suffix;
  FieldDescriptor *field;
  size_t arena_seeding_count;
  LogMessageFatal local_90 [16];
  FieldGeneratorTable *local_80;
  MessageGenerator *local_78;
  anon_class_24_3_fa050984 print_arena_offset;
  Printer *arena_emitter_local;
  Iterator __begin3;
  Iterator __end3;
  
  arena_seeding_count = 0;
  options = &this->options_;
  arena_emitter_local = arena_emitter;
  bVar2 = IsBootstrapProto(options,*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (bVar2) {
    bVar2 = true;
    uVar9 = 0;
    bVar8 = 0;
  }
  else {
    AVar4 = NeedsArenaDestructor(this);
    __begin3.descriptor = this->descriptor_;
    if (*(int *)(__begin3.descriptor + 0x88) < 1) {
      bVar8 = 0;
    }
    else {
      arena_seeding_count = 1;
      if (arena_emitter == (Printer *)0x0) {
        bVar8 = 1;
      }
      else {
        bVar8 = 1;
        io::Printer::Emit(arena_emitter,0xc1,
                          "\n        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +\n            decltype($classname$::$extensions$)::InternalGetArenaOffset(\n                $superclass$::internal_visibility()),\n      "
                         );
        __begin3.descriptor = this->descriptor_;
      }
    }
    bVar2 = this->num_weak_fields_ != 0;
    __begin3.idx = 0;
    __end3.idx = *(int *)(__begin3.descriptor + 4);
    local_80 = &this->field_generators_;
    uVar9 = 0;
    local_78 = this;
    __end3.descriptor = __begin3.descriptor;
    while (bVar3 = protobuf::internal::operator!=(&__begin3,&__end3), bVar3) {
      field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&__begin3);
      print_arena_offset.arena_seeding_count = &arena_seeding_count;
      print_arena_offset.arena_emitter = &arena_emitter_local;
      print_arena_offset.field = &field;
      bVar3 = ShouldSplit(field,options);
      if (bVar3) {
LAB_001cecd4:
        uVar9 = 1;
      }
      else {
        pOVar6 = FieldDescriptor::real_containing_oneof(field);
        if (pOVar6 == (OneofDescriptor *)0x0) {
          bVar3 = FieldDescriptor::is_map(field);
          if (bVar3) {
            GetNewOp::anon_class_24_3_fa050984::operator()
                      (&print_arena_offset,(string_view)(ZEXT816(0x2af559) << 0x40));
            bVar3 = HasDescriptorMethods(*(FileDescriptor **)(local_78->descriptor_ + 0x10),options)
            ;
            if (bVar3) {
              suffix._M_str = "Alt";
              suffix._M_len = 3;
              GetNewOp::anon_class_24_3_fa050984::operator()(&print_arena_offset,suffix);
            }
            bVar8 = 1;
            goto LAB_001cecd4;
          }
          bVar3 = FieldDescriptor::is_repeated(field);
          if (bVar3) {
LAB_001ced6d:
            GetNewOp::anon_class_24_3_fa050984::operator()
                      (&print_arena_offset,(string_view)(ZEXT816(0x2af559) << 0x40));
            bVar8 = 1;
          }
          else {
            pFVar7 = FieldGeneratorTable::get(local_80,field);
            if (((pFVar7->impl_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                ._M_head_impl)->has_trivial_zero_default_ == false) {
              iVar1 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4
                              );
              if (iVar1 - 1U < 8) goto LAB_001cecd4;
              if (iVar1 == 9) {
                CVar5 = protobuf::internal::cpp::
                        EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                                  (field);
                if (CVar5 == FieldOptions_CType_STRING) goto LAB_001cecd4;
                if (CVar5 != FieldOptions_CType_CORD) {
                  if (CVar5 != FieldOptions_CType_STRING_PIECE) {
                    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                              (local_90,
                               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                               ,0xf31);
                    goto LAB_001cee28;
                  }
                  goto LAB_001ced6d;
                }
                if (!bVar2 && AVar4 != kRequired) {
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            (local_90,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xf2b,0x1b,"op.needs_to_run_constructor");
LAB_001cee28:
                  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
                }
              }
              else if (iVar1 == 10) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          (local_90,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                           ,0xf35);
                absl::lts_20240722::log_internal::LogMessage::operator<<
                          ((LogMessage *)local_90,
                           (char (*) [38])"Message should be zero initializable.");
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
              }
            }
          }
        }
      }
      __begin3.idx = __begin3.idx + 1;
    }
    bVar2 = 0x3f < arena_seeding_count || (bVar2 || AVar4 == kRequired);
  }
  return (NewOpRequirements)(uVar9 | (uint3)bVar8 << 8 | (uint3)bVar2 << 0x10);
}

Assistant:

MessageGenerator::NewOpRequirements MessageGenerator::GetNewOp(
    io::Printer* arena_emitter) const {
  size_t arena_seeding_count = 0;
  NewOpRequirements op;
  if (IsBootstrapProto(options_, descriptor_->file())) {
    // To simplify bootstrapping we always use a function for these types.
    // It makes it easier to change the ABI of the `MessageCreator` class.
    op.needs_to_run_constructor = true;
    return op;
  }

  if (NeedsArenaDestructor() == ArenaDtorNeeds::kRequired) {
    // We can't skip the ArenaDtor for these messages.
    op.needs_to_run_constructor = true;
  }

  if (descriptor_->extension_range_count() > 0) {
    op.needs_arena_seeding = true;
    ++arena_seeding_count;
    if (arena_emitter) {
      arena_emitter->Emit(R"cc(
        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +
            decltype($classname$::$extensions$)::InternalGetArenaOffset(
                $superclass$::internal_visibility()),
      )cc");
    }
  }

  if (num_weak_fields_ != 0) {
    op.needs_to_run_constructor = true;
  }

  for (const FieldDescriptor* field : FieldRange(descriptor_)) {
    const auto print_arena_offset = [&](absl::string_view suffix = "") {
      ++arena_seeding_count;
      if (arena_emitter) {
        arena_emitter->Emit(
            {{"field", FieldMemberName(field, false)}, {"suffix", suffix}},
            R"cc(
              PROTOBUF_FIELD_OFFSET($classname$, $field$) +
                  decltype($classname$::$field$)::
                      InternalGetArenaOffset$suffix$(
                          $superclass$::internal_visibility()),
            )cc");
      }
    };
    if (ShouldSplit(field, options_)) {
      op.needs_memcpy = true;
    } else if (field->real_containing_oneof() != nullptr) {
      /* nothing to do */
    } else if (field->is_map()) {
      op.needs_arena_seeding = true;
      // MapField contains an internal vtable pointer we need to copy.
      op.needs_memcpy = true;
      print_arena_offset();
      // Non-lite maps currently have more than one arena pointer in them. Print
      // both.
      if (HasDescriptorMethods(descriptor_->file(), options_)) {
        print_arena_offset("Alt");
      }
    } else if (field->is_repeated()) {
      op.needs_arena_seeding = true;
      print_arena_offset();
    } else {
      const auto& generator = field_generators_.get(field);
      if (generator.has_trivial_zero_default()) {
        /* nothing to do */
      } else {
        switch (field->cpp_type()) {
          case FieldDescriptor::CPPTYPE_INT32:
          case FieldDescriptor::CPPTYPE_INT64:
          case FieldDescriptor::CPPTYPE_UINT32:
          case FieldDescriptor::CPPTYPE_UINT64:
          case FieldDescriptor::CPPTYPE_DOUBLE:
          case FieldDescriptor::CPPTYPE_FLOAT:
          case FieldDescriptor::CPPTYPE_BOOL:
          case FieldDescriptor::CPPTYPE_ENUM:
            op.needs_memcpy = true;
            break;

          case FieldDescriptor::CPPTYPE_STRING:
            switch (internal::cpp::EffectiveStringCType(field)) {
              case FieldOptions::STRING_PIECE:
                op.needs_arena_seeding = true;
                print_arena_offset();
                break;
              case FieldOptions::CORD:
                // Cord fields are currently rejected above because of ArenaDtor
                // requirements.
                ABSL_CHECK(op.needs_to_run_constructor);
                break;
              case FieldOptions::STRING:
                op.needs_memcpy = true;
                break;
              default:
                ABSL_LOG(FATAL);
            }
            break;
          case FieldDescriptor::CPPTYPE_MESSAGE:
            ABSL_LOG(FATAL) << "Message should be zero initializable.";
            break;
        }
      }
    }
  }

  // If we are going to generate too many arena seeding offsets, we can skip the
  // attempt because we know it will fail at compile time and fallback to
  // placement new. The arena seeding code can handle up to an offset of
  // `63 * sizeof(Arena*)`.
  // This prevents generating huge lists that have to be run during constant
  // evaluation to just fail anyway. The actual upper bound is smaller than
  // this, but any reasonable value is enough to prevent long compile times for
  // big messages.
  if (arena_seeding_count >= 64) {
    op.needs_to_run_constructor = true;
  }

  return op;
}